

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_digest.cc
# Opt level: O0

int ASN1_item_digest(ASN1_ITEM *it,EVP_MD *type,void *data,uchar *md,uint *len)

{
  uchar *local_48;
  uchar *str;
  int ret;
  int i;
  uint *len_local;
  uchar *md_local;
  void *asn_local;
  EVP_MD *type_local;
  ASN1_ITEM *it_local;
  
  local_48 = (uchar *)0x0;
  _ret = len;
  len_local = (uint *)md;
  md_local = (uchar *)data;
  asn_local = type;
  type_local = (EVP_MD *)it;
  str._4_4_ = ASN1_item_i2d((ASN1_VALUE *)data,&local_48,it);
  if (local_48 == (uchar *)0x0) {
    it_local._4_4_ = 0;
  }
  else {
    str._0_4_ = EVP_Digest(local_48,(long)str._4_4_,(uchar *)len_local,_ret,(EVP_MD *)asn_local,
                           (ENGINE *)0x0);
    OPENSSL_free(local_48);
    it_local._4_4_ = (int)str;
  }
  return it_local._4_4_;
}

Assistant:

int ASN1_item_digest(const ASN1_ITEM *it, const EVP_MD *type, void *asn,
                     unsigned char *md, unsigned int *len) {
  int i, ret;
  unsigned char *str = NULL;

  i = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(asn), &str, it);
  if (!str) {
    return 0;
  }

  ret = EVP_Digest(str, i, md, len, type, NULL);
  OPENSSL_free(str);
  return ret;
}